

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.h
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * ParseHex<unsigned_char>(string_view hex_str)

{
  long lVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  long in_FS_OFFSET;
  optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *in_stack_ffffffffffffff58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__u;
  optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *this;
  undefined1 in_stack_ffffffffffffffe0 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = (optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
         &stack0xffffffffffffffd8;
  __u = in_RDI;
  TryParseHex<unsigned_char>((string_view)in_stack_ffffffffffffffe0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff58);
  std::optional<std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  value_or<std::vector<unsigned_char,std::allocator<unsigned_char>>>(this,__u);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(__u);
  std::optional<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~optional
            (in_stack_ffffffffffffff58);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<Byte> ParseHex(std::string_view hex_str)
{
    return TryParseHex<Byte>(hex_str).value_or(std::vector<Byte>{});
}